

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

void * __thiscall
google::protobuf::internal::GeneratedMessageReflection::RepeatedFieldData
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field,CppType cpp_type
          ,Descriptor *message_type)

{
  int number;
  bool packed;
  Type TVar1;
  uint32 uVar2;
  LogMessage *pLVar3;
  Descriptor *pDVar4;
  void *pvVar5;
  Descriptor *pDVar6;
  LogFinisher local_a9;
  Descriptor *local_a8;
  LogMessage local_a0;
  LogMessage local_68;
  
  local_a8 = message_type;
  if (*(int *)(field + 0x4c) != 3) {
    LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x899);
    pLVar3 = LogMessage::operator<<(&local_68,"CHECK failed: field->is_repeated(): ");
    LogFinisher::operator=((LogFinisher *)&local_a0,pLVar3);
    LogMessage::~LogMessage(&local_68);
  }
  TVar1 = FieldDescriptor::type(field);
  pDVar6 = local_a8;
  if ((*(CppType *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar1 * 4) != cpp_type) &&
     ((TVar1 = FieldDescriptor::type(field), cpp_type != CPPTYPE_INT32 ||
      (pDVar6 = local_a8, *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar1 * 4) != 8)))) {
    LogMessage::LogMessage
              (&local_a0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x89c);
    pLVar3 = LogMessage::operator<<
                       (&local_a0,
                        "CHECK failed: field->cpp_type() == cpp_type || (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM && cpp_type == FieldDescriptor::CPPTYPE_INT32): "
                       );
    pLVar3 = LogMessage::operator<<
                       (pLVar3,"The type parameter T in RepeatedFieldRef<T> API doesn\'t match ");
    pLVar3 = LogMessage::operator<<
                       (pLVar3,"the actual field type (for enums T should be the generated enum ");
    pLVar3 = LogMessage::operator<<(pLVar3,"type or int32).");
    LogFinisher::operator=(&local_a9,pLVar3);
    pDVar6 = local_a8;
    LogMessage::~LogMessage(&local_a0);
  }
  if ((pDVar6 != (Descriptor *)0x0) &&
     (pDVar4 = FieldDescriptor::message_type(field), pDVar4 != pDVar6)) {
    LogMessage::LogMessage
              (&local_a0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x8a1);
    pLVar3 = LogMessage::operator<<
                       (&local_a0,"CHECK failed: (message_type) == (field->message_type()): ");
    LogFinisher::operator=(&local_a9,pLVar3);
    LogMessage::~LogMessage(&local_a0);
  }
  if (field[0x50] == (FieldDescriptor)0x1) {
    uVar2 = ReflectionSchema::GetExtensionSetOffset(&this->schema_);
    number = *(int *)(field + 0x38);
    TVar1 = FieldDescriptor::type(field);
    packed = FieldDescriptor::is_packed(field);
    pvVar5 = ExtensionSet::MutableRawRepeatedField
                       ((ExtensionSet *)
                        ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2),
                        number,(FieldType)TVar1,packed,field);
  }
  else {
    uVar2 = ReflectionSchema::GetFieldOffsetNonOneof(&this->schema_,field);
    pvVar5 = (void *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2);
  }
  return pvVar5;
}

Assistant:

void* GeneratedMessageReflection::RepeatedFieldData(
    Message* message, const FieldDescriptor* field,
    FieldDescriptor::CppType cpp_type,
    const Descriptor* message_type) const {
  GOOGLE_CHECK(field->is_repeated());
  GOOGLE_CHECK(field->cpp_type() == cpp_type ||
        (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM &&
         cpp_type == FieldDescriptor::CPPTYPE_INT32))
      << "The type parameter T in RepeatedFieldRef<T> API doesn't match "
      << "the actual field type (for enums T should be the generated enum "
      << "type or int32).";
  if (message_type != NULL) {
    GOOGLE_CHECK_EQ(message_type, field->message_type());
  }
  if (field->is_extension()) {
    return MutableExtensionSet(message)->MutableRawRepeatedField(
        field->number(), field->type(), field->is_packed(), field);
  } else {
    return MutableRawNonOneof<char>(message, field);
  }
}